

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

void iemgui_setdialogatoms(t_iemgui *iemgui,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  float fVar2;
  char local_c18 [8];
  char color_2 [1000];
  char local_828 [8];
  char color_1 [1000];
  char local_438 [8];
  char color [1000];
  int i;
  int for_undo;
  t_symbol *srl [3];
  t_float zoom;
  t_atom *argv_local;
  int argc_local;
  t_iemgui *iemgui_local;
  
  fVar2 = (float)iemgui->x_glist->gl_zoom;
  color[0x3e0] = '\0';
  color[0x3e1] = '\0';
  color[0x3e2] = '\0';
  color[0x3e3] = '\0';
  for (; (int)color._992_4_ < argc; color._992_4_ = color._992_4_ + 1) {
    argv[(int)color._992_4_].a_type = A_FLOAT;
    argv[(int)color._992_4_].a_w.w_index = -0x40800000;
  }
  color[0x3e4] = '\x01';
  color[0x3e5] = '\0';
  color[0x3e6] = '\0';
  color[999] = '\0';
  if (0 < argc) {
    argv->a_type = A_FLOAT;
    (argv->a_w).w_float = (float)iemgui->x_w / fVar2;
  }
  if (1 < argc) {
    argv[1].a_type = A_FLOAT;
    argv[1].a_w.w_float = (float)iemgui->x_h / fVar2;
  }
  if (5 < argc) {
    argv[5].a_type = A_FLOAT;
    argv[5].a_w.w_float = (float)((uint)iemgui->x_isa & 1);
  }
  if (6 < argc) {
    argv[6].a_type = A_FLOAT;
    argv[6].a_w.w_index = 0x3f800000;
  }
  if (7 < argc) {
    argv[7].a_type = A_SYMBOL;
    argv[7].a_w = (word)iemgui->x_snd;
  }
  if (8 < argc) {
    argv[8].a_type = A_SYMBOL;
    argv[8].a_w = (word)iemgui->x_rcv;
  }
  if (9 < argc) {
    argv[9].a_type = A_SYMBOL;
    argv[9].a_w = (word)iemgui->x_lab;
  }
  if (10 < argc) {
    argv[10].a_type = A_FLOAT;
    argv[10].a_w.w_float = (float)iemgui->x_ldx;
  }
  if (0xb < argc) {
    argv[0xb].a_type = A_FLOAT;
    argv[0xb].a_w.w_float = (float)iemgui->x_ldy;
  }
  if (0xc < argc) {
    argv[0xc].a_type = A_FLOAT;
    argv[0xc].a_w.w_float = (float)((uint)iemgui->x_fsf & 0x3f);
  }
  if (0xd < argc) {
    argv[0xd].a_type = A_FLOAT;
    argv[0xd].a_w.w_float = (float)iemgui->x_fontsize;
  }
  if (0xe < argc) {
    snprintf(local_438,999,"#%06x",(ulong)(iemgui->x_bcol & 0xffffff));
    color[0x3df] = '\0';
    argv[0xe].a_type = A_SYMBOL;
    ptVar1 = gensym(local_438);
    argv[0xe].a_w.w_symbol = ptVar1;
  }
  if (0xf < argc) {
    snprintf(local_828,999,"#%06x",(ulong)(iemgui->x_fcol & 0xffffff));
    color_1[0x3df] = '\0';
    argv[0xf].a_type = A_SYMBOL;
    ptVar1 = gensym(local_828);
    argv[0xf].a_w.w_symbol = ptVar1;
  }
  if (0x10 < argc) {
    snprintf(local_c18,999,"#%06x",(ulong)(iemgui->x_lcol & 0xffffff));
    color_2[0x3df] = '\0';
    argv[0x10].a_type = A_SYMBOL;
    ptVar1 = gensym(local_c18);
    argv[0x10].a_w.w_symbol = ptVar1;
  }
  return;
}

Assistant:

void iemgui_setdialogatoms(t_iemgui *iemgui, int argc, t_atom*argv)
{
#define SETCOLOR(a, col) do {char color[MAXPDSTRING]; snprintf(color, MAXPDSTRING-1, "#%06x", 0xffffff & col); color[MAXPDSTRING-1] = 0; SETSYMBOL(a, gensym(color));} while(0)
    t_float zoom = iemgui->x_glist->gl_zoom;
    t_symbol *srl[3];
    int for_undo = 1;
    int i;
    for(i=0; i<argc; i++)
        SETFLOAT(argv+i, -1); /* initialize */

    if(!for_undo)
        iemgui_properties(iemgui, srl);

    if(argc> 0) SETFLOAT (argv+ 0, iemgui->x_w/zoom);
    if(argc> 1) SETFLOAT (argv+ 1, iemgui->x_h/zoom);
    if(argc> 5) SETFLOAT (argv+ 5, iemgui->x_isa.x_loadinit);
    if(argc> 6) SETFLOAT (argv+ 6, 1); /* num */
    if(argc> 7) SETSYMBOL(argv+ 7, for_undo?iemgui->x_snd:srl[0]);
    if(argc> 8) SETSYMBOL(argv+ 8, for_undo?iemgui->x_rcv:srl[1]);
    if(argc> 9) SETSYMBOL(argv+ 9, for_undo?iemgui->x_lab:srl[2]);
    if(argc>10) SETFLOAT (argv+10, iemgui->x_ldx);
    if(argc>11) SETFLOAT (argv+11, iemgui->x_ldy);
    if(argc>12) SETFLOAT (argv+12, iemgui->x_fsf.x_font_style);
    if(argc>13) SETFLOAT (argv+13, iemgui->x_fontsize);
    if(argc>14) SETCOLOR (argv+14, iemgui->x_bcol);
    if(argc>15) SETCOLOR (argv+15, iemgui->x_fcol);
    if(argc>16) SETCOLOR (argv+16, iemgui->x_lcol);
}